

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  byte bVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  Frame *pFVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Frame *pFVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  IMkvReader *pReader;
  ulong uVar13;
  long lVar14;
  Frame *curr;
  Frame *pFVar15;
  Frame *f;
  uchar val;
  uchar biased_count;
  undefined8 local_60;
  Frame *local_58;
  long len;
  ulong local_48;
  IMkvReader *local_40;
  longlong value;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar12 = this->m_start;
  lVar11 = this->m_size;
  pReader = pCluster->m_pSegment->m_pReader;
  lVar3 = ReadUInt(pReader,lVar12,&len);
  local_58 = (Frame *)len;
  this->m_track = lVar3;
  if (lVar3 < 1) {
    return -2;
  }
  if (lVar11 - len < 2 || lVar11 < len) {
    return -2;
  }
  lVar14 = lVar12 + len;
  lVar4 = UnserializeInt(pReader,lVar14,2,&value);
  if (lVar4 != 0) {
    return -2;
  }
  if ((short)value != value) {
    return -2;
  }
  lVar12 = lVar12 + lVar11;
  this->m_timecode = (short)value;
  if (lVar12 <= lVar14 + 2) {
    return -2;
  }
  local_40 = pReader;
  iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar14 + 2,1,&this->m_flags);
  if (iVar2 != 0) {
    return -2;
  }
  bVar1 = this->m_flags >> 1;
  lVar4 = lVar14 + 3;
  if ((bVar1 & 3) == 0) {
    this->m_frame_count = 1;
    pFVar5 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar5;
    if (pFVar5 == (Frame *)0x0) {
      return -1;
    }
    pFVar5->pos = lVar4;
    if (lVar12 - lVar4 == 0 || lVar12 < lVar4) {
      return -2;
    }
    pFVar5->len = lVar12 - lVar4;
  }
  else {
    if (lVar12 <= lVar4) {
      return -2;
    }
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,&biased_count);
    if (iVar2 != 0) {
      return -2;
    }
    local_60 = CONCAT44(local_60._4_4_,(uint)bVar1) & 0xffffffff00000003;
    uVar10 = biased_count + 1;
    this->m_frame_count = uVar10;
    local_48 = (ulong)(uVar10 * 0x10);
    pFVar5 = (Frame *)operator_new__(local_48,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar5;
    if (pFVar5 == (Frame *)0x0) {
      return -1;
    }
    lVar14 = lVar14 + 4;
    if ((int)local_60 == 2) {
      lVar4 = lVar12 - lVar14;
      if (lVar4 == 0 || lVar12 < lVar14) {
        return -2;
      }
      lVar6 = lVar4 / (long)(ulong)uVar10;
      if (lVar4 % (long)(ulong)uVar10 != 0) {
        return -2;
      }
      if (lVar6 < 1) {
        return -2;
      }
      lVar4 = ((long)local_58 - lVar11) + 4;
      for (lVar11 = (ulong)biased_count * 0x10 + 0x10; lVar11 != 0; lVar11 = lVar11 + -0x10) {
        if (lVar12 < lVar14 + lVar6) {
          return -2;
        }
        pFVar5->pos = lVar14;
        pFVar5->len = lVar6;
        pFVar5 = pFVar5 + 1;
        lVar4 = lVar4 + lVar6;
        lVar14 = lVar14 + lVar6;
      }
      if (lVar4 != 0) {
        return -2;
      }
    }
    else {
      if ((int)local_60 == 1) {
        local_58 = (Frame *)((long)&pFVar5->pos + local_48);
        local_60 = 0;
        for (; 1 < (int)uVar10; uVar10 = uVar10 - 1) {
          lVar11 = 0;
          do {
            if (lVar12 <= lVar14) {
              return -2;
            }
            iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar14,1,&val);
            if (iVar2 != 0) {
              return -2;
            }
            lVar14 = lVar14 + 1;
            lVar11 = lVar11 + (ulong)val;
          } while ((ulong)val == 0xff);
          if (local_58 <= pFVar5 + 1) {
            return -2;
          }
          pFVar5->pos = 0;
          if (lVar11 == 0) {
            return -2;
          }
          pFVar5->len = lVar11;
          local_60 = local_60 + lVar11;
          pFVar5 = pFVar5 + 1;
          pReader = local_40;
        }
        lVar11 = lVar12 - lVar14;
        if (pFVar5 + 1 != local_58 || (lVar12 < lVar14 || local_58 <= pFVar5)) {
          return -2;
        }
        pFVar5->pos = 0;
        if (lVar11 < (long)local_60) {
          return -2;
        }
        if (lVar11 - local_60 == 0 || lVar11 < (long)local_60) {
          return -2;
        }
        pFVar5->len = lVar11 - local_60;
        for (pFVar5 = this->m_frames; pFVar5 != local_58; pFVar5 = pFVar5 + 1) {
          lVar11 = pFVar5->len + lVar14;
          if (lVar12 < lVar11) {
            return -2;
          }
          pFVar5->pos = lVar14;
          lVar14 = lVar11;
        }
      }
      else {
        if (lVar12 <= lVar14) {
          return -2;
        }
        local_60 = (ulong)biased_count;
        uVar7 = ReadUInt(pReader,lVar14,&len);
        if ((long)uVar7 < 1) {
          return -2;
        }
        lVar14 = lVar14 + len;
        if (lVar12 < (long)(lVar14 + uVar7) || lVar12 < lVar14) {
          return -2;
        }
        pFVar9 = this->m_frames;
        iVar2 = this->m_frame_count;
        pFVar5 = pFVar9 + iVar2;
        pFVar9->pos = 0;
        pFVar9->len = uVar7;
        local_48 = (long)iVar2 * 0x10 + -0x20;
        uVar8 = local_60;
        uVar13 = uVar7;
        while( true ) {
          pFVar15 = pFVar9 + 1;
          local_58 = (Frame *)CONCAT44(local_58._4_4_,(uint)uVar8);
          if ((uint)uVar8 < 2) break;
          if (lVar12 <= lVar14) {
            return -2;
          }
          if (pFVar5 <= pFVar9) {
            return -2;
          }
          if (pFVar9->len != uVar7) {
            return -2;
          }
          if (pFVar5 <= pFVar15) {
            return -2;
          }
          pFVar15->pos = 0;
          lVar3 = ReadUInt(local_40,lVar14,&len);
          if (lVar3 < 0) {
            return -2;
          }
          lVar14 = lVar14 + len;
          if (lVar12 < lVar14) {
            return -2;
          }
          uVar7 = uVar7 + lVar3 + (-1L << ((char)len * '\a' - 1U & 0x3f)) + 1;
          if ((long)uVar7 < 1) {
            return -2;
          }
          pFVar9[1].len = uVar7;
          if ((long)(uVar7 ^ 0x7fffffffffffffff) < (long)uVar13) {
            return -2;
          }
          uVar13 = uVar13 + uVar7;
          uVar8 = (ulong)((int)local_58 - 1);
          local_48 = local_48 + -0x10;
          pFVar9 = pFVar15;
        }
        if ((int)local_60 != 0) {
          lVar11 = lVar12 - lVar14;
          if (lVar12 < lVar14) {
            return -2;
          }
          if (pFVar5 <= pFVar9) {
            return -2;
          }
          if (pFVar9->len != uVar7) {
            return -2;
          }
          if (pFVar5 <= pFVar15) {
            return -2;
          }
          if (local_48 != 0) {
            return -2;
          }
          pFVar15->pos = 0;
          if (lVar11 < (long)uVar13) {
            return -2;
          }
          if (lVar11 - uVar13 == 0 || lVar11 < (long)uVar13) {
            return -2;
          }
          pFVar9[1].len = lVar11 - uVar13;
        }
        for (pFVar9 = this->m_frames; pFVar9 != pFVar5; pFVar9 = pFVar9 + 1) {
          lVar11 = pFVar9->len + lVar14;
          if (lVar12 < lVar11) {
            return -2;
          }
          pFVar9->pos = lVar14;
          lVar14 = lVar11;
        }
      }
      if (lVar14 != lVar12) {
        return -2;
      }
    }
  }
  return 0;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}